

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_system.cpp
# Opt level: O2

int main(int argc,char **argv,char **env)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  runtime_error *prVar5;
  char *pcVar6;
  byte bVar7;
  string command;
  string key;
  string example;
  string local_208 [32];
  ostringstream ss;
  wstring wexample;
  string value;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&example,anon_var_dwarf_3e44,(allocator<char> *)&ss);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&wexample,L"ש-м-ν",(allocator<wchar_t> *)&ss);
  if (argc == 2) {
    pcVar6 = argv[1];
    if (*pcVar6 == '-') {
      if (pcVar6[1] != 'n') {
        if (pcVar6[1] == 'w') {
          poVar3 = std::operator<<((ostream *)&std::cout,"Wide API is irrelevant");
          iVar2 = 0;
          std::endl<char,std::char_traits<char>>(poVar3);
          goto LAB_0010265e;
        }
        pcVar6 = "Invalid parameters expected \'-n/-w\'";
        poVar3 = (ostream *)&std::cout;
        goto LAB_0010243e;
      }
      iVar2 = setenv("NOWIDE_TEST",example._M_dataplus._M_p,1);
      if (iVar2 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        poVar3 = std::operator<<((ostream *)&ss,
                                 "Error nowide::setenv(\"NOWIDE_TEST\",example.c_str(),1) == 0 in ")
        ;
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x41);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,(string *)&command);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar2 = setenv("NOWIDE_TEST_NONE",example._M_dataplus._M_p,1);
      if (iVar2 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        poVar3 = std::operator<<((ostream *)&ss,
                                 "Error nowide::setenv(\"NOWIDE_TEST_NONE\",example.c_str(),1) == 0 in "
                                );
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x42);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,(string *)&command);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar2 = unsetenv("NOWIDE_TEST_NONE");
      if (iVar2 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        poVar3 = std::operator<<((ostream *)&ss,
                                 "Error nowide::unsetenv(\"NOWIDE_TEST_NONE\") == 0 in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x43);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,(string *)&command);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&command,"\"",(allocator<char> *)&ss);
      std::__cxx11::string::append((char *)&command);
      std::__cxx11::string::append((char *)&command);
      std::__cxx11::string::append((string *)&command);
      iVar2 = system(command._M_dataplus._M_p);
      if (iVar2 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        poVar3 = std::operator<<((ostream *)&ss,"Error nowide::system(command.c_str()) == 0 in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4d);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,(string *)&key);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"Parent ok");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      bVar1 = std::operator==(pcVar6,&example);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        poVar3 = std::operator<<((ostream *)&ss,"Error argv[1]==example in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x19);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,(string *)&command);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (argv[2] != (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        poVar3 = std::operator<<((ostream *)&ss,"Error argv[2] == 0 in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1a);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,(string *)&command);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar6 = getenv("NOWIDE_TEST");
      if (pcVar6 == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        poVar3 = std::operator<<((ostream *)&ss,"Error nowide::getenv(\"NOWIDE_TEST\") in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1b);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,(string *)&command);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar4 = getenv("NOWIDE_TEST_NONE");
      if (pcVar4 != (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        poVar3 = std::operator<<((ostream *)&ss,
                                 "Error nowide::getenv(\"NOWIDE_TEST_NONE\") == 0 in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1c);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,(string *)&command);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar1 = std::operator==(pcVar6,&example);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        poVar3 = std::operator<<((ostream *)&ss,"Error nowide::getenv(\"NOWIDE_TEST\")==example in "
                                );
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1d);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,(string *)&command);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::operator+(&command,"NOWIDE_TEST=",&example);
      bVar7 = 0;
      for (; pcVar6 = *env, pcVar6 != (char *)0x0; env = env + 1) {
        pcVar4 = strchr(pcVar6,0x3d);
        if (pcVar4 == (char *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
          poVar3 = std::operator<<((ostream *)&ss,"Error key_end in ");
          poVar3 = std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,':');
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x24);
          poVar3 = std::operator<<(poVar3," ");
          std::operator<<(poVar3,"main");
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar5,(string *)&key);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        key._M_dataplus._M_p = (pointer)&key.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&key,pcVar6,pcVar4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&value,pcVar4 + 1,(allocator<char> *)&ss);
        pcVar6 = getenv(key._M_dataplus._M_p);
        if (pcVar6 == (char *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
          poVar3 = std::operator<<((ostream *)&ss,"Error nowide::getenv(key.c_str()) in ");
          poVar3 = std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,':');
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x27);
          poVar3 = std::operator<<(poVar3," ");
          std::operator<<(poVar3,"main");
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar5,local_208);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        bVar1 = std::operator==(pcVar6,&value);
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
          poVar3 = std::operator<<((ostream *)&ss,"Error nowide::getenv(key.c_str()) == value in ");
          poVar3 = std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,':');
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x28);
          poVar3 = std::operator<<(poVar3," ");
          std::operator<<(poVar3,"main");
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar5,local_208);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        bVar1 = std::operator==(*env,&command);
        bVar7 = bVar7 | bVar1;
        std::__cxx11::string::~string((string *)&value);
        std::__cxx11::string::~string((string *)&key);
      }
      if (bVar7 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        poVar3 = std::operator<<((ostream *)&ss,"Error found in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2c);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,(string *)&key);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"Subprocess ok");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::__cxx11::string::~string((string *)&command);
    iVar2 = 0;
  }
  else {
    pcVar6 = "Invalid parameters";
    poVar3 = (ostream *)&std::cerr;
LAB_0010243e:
    poVar3 = std::operator<<(poVar3,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar2 = 1;
  }
LAB_0010265e:
  std::__cxx11::wstring::~wstring((wstring *)&wexample);
  std::__cxx11::string::~string((string *)&example);
  return iVar2;
}

Assistant:

int main(int argc,char **argv,char **env)
{
    try {
        std::string example = "\xd7\xa9-\xd0\xbc-\xce\xbd";
        std::wstring wexample = L"\u05e9-\u043c-\u03bd";
        nowide::args a(argc,argv,env);
        if(argc==2 && argv[1][0]!='-') {
            TEST(argv[1]==example);
            TEST(argv[2] == 0);
            TEST(nowide::getenv("NOWIDE_TEST"));
            TEST(nowide::getenv("NOWIDE_TEST_NONE") == 0);
            TEST(nowide::getenv("NOWIDE_TEST")==example);
            std::string sample = "NOWIDE_TEST=" + example;
            bool found = false;
            for(char **e=env;*e!=0;e++) {
				char *eptr = *e;
				//printf("%s\n",eptr);
                char *key_end = strchr(eptr,'=');
                TEST(key_end);
                std::string key = std::string(eptr,key_end);
                std::string value = key_end + 1;
		        TEST(nowide::getenv(key.c_str()));
                TEST(nowide::getenv(key.c_str()) == value);
                if(*e == sample)
                    found = true;
            }
            TEST(found);
            std::cout << "Subprocess ok" << std::endl;
        }
        else if(argc==2 && argv[1][0]=='-') {
            switch(argv[1][1]) {
            case 'w': 
                {
                    #ifdef NOWIDE_WINDOWS
                    std::wstring env = L"NOWIDE_TEST=" + wexample;
                    _wputenv(env.c_str());
                    std::wstring wcommand = nowide::widen(argv[0]);
                    wcommand += L" ";
                    wcommand += wexample;
                    TEST(_wsystem(wcommand.c_str()) == 0);
                    std::cout << "Wide Parent ok" << std::endl;
                    #else
                    std::cout << "Wide API is irrelevant" << std::endl;
                    #endif
                }
                return 0;
            case 'n':
                TEST(nowide::setenv("NOWIDE_TEST",example.c_str(),1) == 0);
                TEST(nowide::setenv("NOWIDE_TEST_NONE",example.c_str(),1) == 0);
                TEST(nowide::unsetenv("NOWIDE_TEST_NONE") == 0);
                break;
            default:
                std::cout << "Invalid parameters expected '-n/-w'" << std::endl;
                return 1;
            }
            std::string command = "\"";
            command += argv[0];
            command += "\" ";
            command += example;
            TEST(nowide::system(command.c_str()) == 0);
            std::cout << "Parent ok" << std::endl;
        }
        else {
            std::cerr << "Invalid parameters" << std::endl;
            return 1;
        }
        return 0;
    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return 1;
    }
}